

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLineNurbs.cpp
# Opt level: O1

void __thiscall
chrono::geometry::ChLineNurbs::SetupData
          (ChLineNurbs *this,int morder,
          vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_> *mpoints,
          ChVectorDynamic<> *mknots,ChVectorDynamic<> *weights)

{
  ChVectorDynamic<> *pCVar1;
  double *pdVar2;
  double *pdVar3;
  double *pdVar4;
  ulong uVar5;
  double *pdVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  Index size;
  ulong uVar14;
  ChException *pCVar15;
  long lVar16;
  long lVar17;
  ActualDstType actualDst;
  int iVar18;
  ActualDstType actualDst_1;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  if (morder < 1) {
    pCVar15 = (ChException *)__cxa_allocate_exception(0x28);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"ChLineNurbs::SetupData requires order >= 1.","");
    ChException::ChException(pCVar15,&local_50);
    __cxa_throw(pCVar15,&ChException::typeinfo,ChException::~ChException);
  }
  uVar14 = ((long)(mpoints->
                  super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish -
            (long)(mpoints->
                  super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                  )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
  if (uVar14 < morder + 1) {
    pCVar15 = (ChException *)__cxa_allocate_exception(0x28);
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_70,
               "ChLineNurbs::SetupData requires at least order+1 control points.","");
    ChException::ChException(pCVar15,&local_70);
    __cxa_throw(pCVar15,&ChException::typeinfo,ChException::~ChException);
  }
  if ((mknots != (ChVectorDynamic<> *)0x0) &&
     ((mknots->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows !=
      (ulong)(uint)morder + 1 + uVar14)) {
    pCVar15 = (ChException *)__cxa_allocate_exception(0x28);
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_90,"ChLineNurbs::SetupData: knots must have size=n_points+order+1",
               "");
    ChException::ChException(pCVar15,&local_90);
    __cxa_throw(pCVar15,&ChException::typeinfo,ChException::~ChException);
  }
  if ((weights != (ChVectorDynamic<> *)0x0) &&
     ((weights->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows !=
      uVar14)) {
    pCVar15 = (ChException *)__cxa_allocate_exception(0x28);
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b0,"ChLineNurbs::SetupData: weights must have size=n_points","");
    ChException::ChException(pCVar15,&local_b0);
    __cxa_throw(pCVar15,&ChException::typeinfo,ChException::~ChException);
  }
  this->p = morder;
  std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>::operator=
            (&this->points,mpoints);
  iVar18 = (int)((long)(this->points).
                       super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->points).
                       super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x55555555;
  if (mknots == (ChVectorDynamic<> *)0x0) {
    pCVar1 = &this->knots;
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              (&pCVar1->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
               (long)(iVar18 + 1 + this->p));
    lVar17 = (this->knots).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_rows;
    if (lVar17 < 0) goto LAB_0081d74f;
    if (lVar17 != 0) {
      memset((pCVar1->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
             m_data,0,lVar17 << 3);
    }
    ChBasisToolsBspline::ComputeKnotUniformMultipleEnds(pCVar1,this->p,0.0,1.0);
  }
  else {
    pdVar4 = (mknots->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
             m_data;
    uVar14 = (mknots->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
             m_rows;
    if ((this->knots).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
        m_rows != uVar14) {
      Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                (&(this->knots).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
                 uVar14,1);
    }
    uVar5 = (this->knots).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
            m_rows;
    if (uVar5 != uVar14) goto LAB_0081d677;
    pdVar6 = (this->knots).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_data;
    uVar14 = uVar5 + 7;
    if (-1 < (long)uVar5) {
      uVar14 = uVar5;
    }
    uVar14 = uVar14 & 0xfffffffffffffff8;
    if (7 < (long)uVar5) {
      lVar17 = 0;
      do {
        pdVar3 = pdVar4 + lVar17;
        dVar7 = pdVar3[1];
        dVar8 = pdVar3[2];
        dVar9 = pdVar3[3];
        dVar10 = pdVar3[4];
        dVar11 = pdVar3[5];
        dVar12 = pdVar3[6];
        dVar13 = pdVar3[7];
        pdVar2 = pdVar6 + lVar17;
        *pdVar2 = *pdVar3;
        pdVar2[1] = dVar7;
        pdVar2[2] = dVar8;
        pdVar2[3] = dVar9;
        pdVar2[4] = dVar10;
        pdVar2[5] = dVar11;
        pdVar2[6] = dVar12;
        pdVar2[7] = dVar13;
        lVar17 = lVar17 + 8;
      } while (lVar17 < (long)uVar14);
    }
    if ((long)uVar14 < (long)uVar5) {
      do {
        pdVar6[uVar14] = pdVar4[uVar14];
        uVar14 = uVar14 + 1;
      } while (uVar5 != uVar14);
    }
  }
  pCVar1 = &this->weights;
  if (weights == (ChVectorDynamic<> *)0x0) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              (&pCVar1->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,(long)iVar18)
    ;
    lVar17 = (this->weights).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
             m_storage.m_rows;
    if (lVar17 < 0) {
LAB_0081d74f:
      __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                    ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                    "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, 1>]"
                   );
    }
    if (lVar17 != 0) {
      pdVar4 = (pCVar1->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
               m_data;
      lVar16 = 0;
      do {
        *(undefined8 *)((long)pdVar4 + lVar16) = 0x3ff0000000000000;
        lVar16 = lVar16 + 8;
      } while (lVar17 << 3 != lVar16);
    }
  }
  else {
    pdVar4 = (weights->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
             m_data;
    uVar14 = (weights->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
             m_rows;
    if ((this->weights).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
        m_rows != uVar14) {
      Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                (&pCVar1->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,uVar14,1);
    }
    uVar5 = (this->weights).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
            .m_rows;
    if (uVar5 != uVar14) {
LAB_0081d677:
      __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                    "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2fd,
                    "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::Matrix<double, -1, 1>, T1 = double, T2 = double]"
                   );
    }
    pdVar6 = (pCVar1->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
             m_data;
    uVar14 = uVar5 + 7;
    if (-1 < (long)uVar5) {
      uVar14 = uVar5;
    }
    uVar14 = uVar14 & 0xfffffffffffffff8;
    if (7 < (long)uVar5) {
      lVar17 = 0;
      do {
        pdVar2 = pdVar4 + lVar17;
        dVar7 = pdVar2[1];
        dVar8 = pdVar2[2];
        dVar9 = pdVar2[3];
        dVar10 = pdVar2[4];
        dVar11 = pdVar2[5];
        dVar12 = pdVar2[6];
        dVar13 = pdVar2[7];
        pdVar3 = pdVar6 + lVar17;
        *pdVar3 = *pdVar2;
        pdVar3[1] = dVar7;
        pdVar3[2] = dVar8;
        pdVar3[3] = dVar9;
        pdVar3[4] = dVar10;
        pdVar3[5] = dVar11;
        pdVar3[6] = dVar12;
        pdVar3[7] = dVar13;
        lVar17 = lVar17 + 8;
      } while (lVar17 < (long)uVar14);
    }
    if ((long)uVar14 < (long)uVar5) {
      do {
        pdVar6[uVar14] = pdVar4[uVar14];
        uVar14 = uVar14 + 1;
      } while (uVar5 != uVar14);
    }
  }
  return;
}

Assistant:

void ChLineNurbs::SetupData(
    int morder,                         ///< order p: 1= linear, 2=quadratic, etc.
    std::vector<ChVector<> >& mpoints,  ///< control points, size n. Required: at least n >= p+1
    ChVectorDynamic<>* mknots,          ///< knots, size k. Required k=n+p+1. If not provided, initialized to uniform.
    ChVectorDynamic<>* weights          ///< weights, size w. Required w=n. If not provided, all weights as 1.
) {
    if (morder < 1)
        throw ChException("ChLineNurbs::SetupData requires order >= 1.");

    if (mpoints.size() < morder + 1)
        throw ChException("ChLineNurbs::SetupData requires at least order+1 control points.");

    if (mknots && mknots->size() != (mpoints.size() + morder + 1))
        throw ChException("ChLineNurbs::SetupData: knots must have size=n_points+order+1");

    if (weights && weights->size() != mpoints.size())
        throw ChException("ChLineNurbs::SetupData: weights must have size=n_points");

    this->p = morder;
    this->points = mpoints;
    int n = (int)points.size();

    if (mknots)
        this->knots = *mknots;
    else {
        this->knots.setZero(n + p + 1);
        ChBasisToolsBspline::ComputeKnotUniformMultipleEnds(this->knots, p);
    }

    if (weights)
        this->weights = *weights;
    else
        this->weights.setConstant(n, 1.0);
}